

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O2

void __thiscall
Random_keys::geraPopAleatoriaConfInicial(Random_keys *this,Graph *g,int *idsAbertos,int nAbertos)

{
  RK_Individual *this_00;
  int iVar1;
  RK_Individual *ind;
  
  Graph::markOneDirectionInEdges(g);
  for (iVar1 = 0; iVar1 < this->tamPop; iVar1 = iVar1 + 1) {
    this_00 = (RK_Individual *)operator_new(0x28);
    RK_Individual::RK_Individual(this_00,g->edgesSize / 2 - g->numberOfNonModifiable);
    ind = this_00;
    if (iVar1 == 0) {
      RK_Individual::geraPesosConfInicial(this_00,idsAbertos,nAbertos,g);
    }
    else {
      RK_Individual::generate_random_weights(this_00);
    }
    std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::push_back(&this->popAtual,&ind);
  }
  std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=
            (&this->popAnterior,&this->popAtual);
  return;
}

Assistant:

void Random_keys::geraPopAleatoriaConfInicial(Graph *g, int *idsAbertos, int nAbertos){

    g->markOneDirectionInEdges();
    RK_Individual *ind;
    for(int i=0; i<this->tamPop; i++){

        ind = new RK_Individual(g->getEdgesSizes() / 2 - g->getNumberOfNonModifiable());
        if(i==0){
            ind->geraPesosConfInicial(idsAbertos, nAbertos, g);
        }
        else{
            ind->generate_random_weights();
        }

        popAtual.push_back(ind);
    }
    popAnterior = popAtual;
}